

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

int beagleSetTipPartials(int instance,int tipIndex,double *inPartials)

{
  pointer ppBVar1;
  BeagleImpl *pBVar2;
  int iVar3;
  
  ppBVar1 = (instances->
            super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  iVar3 = -4;
  if (((ulong)(long)instance <=
       (ulong)((long)(instances->
                     super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3)) &&
     (pBVar2 = ppBVar1[instance], pBVar2 != (BeagleImpl *)0x0)) {
    iVar3 = (**(code **)(*(long *)pBVar2 + 0x30))();
  }
  return iVar3;
}

Assistant:

int beagleSetTipPartials(int instance,
                   int tipIndex,
                   const double* inPartials) {
    DEBUG_START_TIME();
    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->setTipPartials(tipIndex, inPartials);
        DEBUG_END_TIME();
        return returnValue;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
}